

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindHitGroupByIndex
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,Uint32 BindingIndex,
          char *pShaderGroupName,void *pData,Uint32 DataSize)

{
  uint uVar1;
  RenderDeviceVkImpl *pRVar2;
  bool bVar3;
  char (*Args_1) [61];
  ulong __new_size;
  long lVar4;
  ulong DataSize_00;
  string msg;
  string local_50;
  
  bVar3 = (DataSize != 0) != (pData == (void *)0x0);
  Args_1 = (char (*) [61])CONCAT71((int7)((ulong)pData >> 8),bVar3);
  if (!bVar3) {
    FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    Args_1 = (char (*) [61])0xb1;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
               "BindHitGroupByIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((pData != (void *)0x0) && (this->m_ShaderRecordSize != DataSize)) {
    FormatString<char[26],char[61]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",Args_1)
    ;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
               "BindHitGroupByIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xb2);
    std::__cxx11::string::~string((string *)&local_50);
  }
  DataSize_00 = (ulong)this->m_ShaderRecordStride;
  pRVar2 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  lVar4 = DataSize_00 * BindingIndex;
  __new_size = (long)(this->m_HitGroupsRecord).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_HitGroupsRecord).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  if (__new_size <= DataSize_00 + lVar4) {
    __new_size = DataSize_00 + lVar4;
  }
  uVar1 = (pRVar2->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
          ShaderGroupHandleSize;
  local_50._M_dataplus._M_p._0_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_HitGroupsRecord,__new_size,(value_type_conflict2 *)&local_50);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&((this->m_pPSO).m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
             pShaderGroupName,
             (this->m_HitGroupsRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4,DataSize_00);
  memcpy((this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
         ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar1 + lVar4,pData,(ulong)DataSize);
  this->m_Changed = true;
  OnBindHitGroup(this,(TopLevelASImplType *)0x0,(ulong)BindingIndex);
  return;
}

Assistant:

BindHitGroupByIndex(Uint32      BindingIndex,
                                                const char* pShaderGroupName,
                                                const void* pData,
                                                Uint32      DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        const size_t Stride    = this->m_ShaderRecordStride;
        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Offset    = BindingIndex * Stride;

        this->m_HitGroupsRecord.resize(std::max(this->m_HitGroupsRecord.size(), Offset + Stride), Uint8{EmptyElem});

        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_HitGroupsRecord.data() + Offset, Stride);
        std::memcpy(this->m_HitGroupsRecord.data() + Offset + GroupSize, pData, DataSize);
        this->m_Changed = true;

#ifdef DILIGENT_DEVELOPMENT
        OnBindHitGroup(nullptr, BindingIndex);
#endif
    }